

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Poly::Get_y_dxdx(ChFunction_Poly *this,double x)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  
  dVar6 = 0.0;
  if (1 < this->order) {
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 2;
      iVar4 = (int)lVar5;
      dVar2 = this->coeff[lVar5 + 2];
      auVar7._0_8_ = pow(x,(double)iVar4);
      auVar7._8_56_ = extraout_var;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar6;
      lVar5 = lVar5 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (double)((int)lVar1 * (iVar4 + 1)) * dVar2;
      auVar3 = vfmadd231sd_fma(auVar8,auVar7._0_16_,auVar3);
      dVar6 = auVar3._0_8_;
    } while (lVar1 < this->order);
  }
  return dVar6;
}

Assistant:

double ChFunction_Poly::Get_y_dxdx(double x) const {
    double total = 0;
    for (int i = 2; i <= order; i++) {
        total += ((double)(i * (i - 1)) * coeff[i] * pow(x, ((double)(i - 2))));
    }
    return total;
}